

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_icc_check_length
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_const_charp name,
              png_uint_32 profile_length)

{
  char *reason;
  
  if (profile_length < 0x84) {
    reason = "too short";
  }
  else {
    if (png_ptr->user_chunk_malloc_max == 0) {
      return 1;
    }
    if ((ulong)profile_length <= png_ptr->user_chunk_malloc_max) {
      return 1;
    }
    reason = "exceeds application limits";
  }
  png_icc_profile_error(png_ptr,colorspace,name,(ulong)profile_length,reason);
  return 0;
}

Assistant:

static int /* bool */
icc_check_length(png_const_structrp png_ptr, png_colorspacerp colorspace,
    png_const_charp name, png_uint_32 profile_length)
{
   if (profile_length < 132)
      return png_icc_profile_error(png_ptr, colorspace, name, profile_length,
          "too short");
   return 1;
}